

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

void save_d_flags(memfile *mf,d_flags f)

{
  uint uVar1;
  
  uVar1 = (int)f * 0x40000000 + ((uint)f & 0xc) * 0x4000000;
  mwrite32(mf,((uint)f & 0x70) << 0x15 | (uVar1 >> 1 & 0x50000000) + (uVar1 & 0x50000000) * 2);
  return;
}

Assistant:

void save_d_flags(struct memfile *mf, d_flags f)
{
    unsigned int dflags;
    
    /* bitfield layouts are architecture and compiler-dependent, so d_flags can't be written directly */
    dflags = (f.town << 31) | (f.hellish << 30) | (f.maze_like << 29) |
             (f.rogue_like << 28) | (f.align << 25);
    mwrite32(mf, dflags);
}